

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

CropResizeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_cropresize(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0xd4) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0xd4;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x48);
    CropResizeLayerParams::CropResizeLayerParams(this_00.cropresize_);
    (this->layer_).cropresize_ = (CropResizeLayerParams *)this_00;
  }
  return (CropResizeLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::CropResizeLayerParams* NeuralNetworkLayer::mutable_cropresize() {
  if (!has_cropresize()) {
    clear_layer();
    set_has_cropresize();
    layer_.cropresize_ = new ::CoreML::Specification::CropResizeLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.cropResize)
  return layer_.cropresize_;
}